

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O1

int STRING_empty(STRING_HANDLE handle)

{
  char *pcVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  
  if (handle == (STRING_HANDLE)0x0) {
    iVar3 = 0x2a8;
  }
  else {
    pcVar1 = (char *)realloc(handle->s,1);
    if (pcVar1 == (char *)0x0) {
      p_Var2 = xlogging_get_log_function();
      iVar3 = 0x2b2;
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/strings.c"
                  ,"STRING_empty",0x2b0,1,"Failure reallocating value.");
      }
    }
    else {
      handle->s = pcVar1;
      *pcVar1 = '\0';
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int STRING_empty(STRING_HANDLE handle)
{
    int result;
    if (handle == NULL)
    {
        /* Codes_SRS_STRING_07_023: [STRING_empty shall return a nonzero value if the STRING_HANDLE is NULL.] */
        result = MU_FAILURE;
    }
    else
    {
        STRING* s1 = (STRING*)handle;
        char* temp = (char*)realloc(s1->s, 1);
        if (temp == NULL)
        {
            LogError("Failure reallocating value.");
            /* Codes_SRS_STRING_07_030: [STRING_empty shall return a nonzero value if the STRING_HANDLE is NULL.] */
            result = MU_FAILURE;
        }
        else
        {
            s1->s = temp;
            s1->s[0] = '\0';
            result = 0;
        }
    }
    return result;
}